

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TSS_Hash(TSS_DEVICE *tpm,BYTE *data,UINT32 dataSize,TPMI_ALG_HASH hashAlg,
               TPM2B_DIGEST *outHash)

{
  TPM_RC TVar1;
  TPM2B_MAX_BUFFER dataBuf;
  TPM2B_MAX_BUFFER local_41a;
  
  local_41a.t.size = (UINT16)dataSize;
  TVar1 = 0x95;
  if (dataSize < 0x401) {
    MemoryCopy(local_41a.t.buffer,data,dataSize);
    TVar1 = TPM2_Hash(tpm,&local_41a,hashAlg,0x40000007,outHash,(TPMT_TK_HASHCHECK *)0x0);
  }
  return TVar1;
}

Assistant:

TPM_RC
TSS_Hash(
    TSS_DEVICE             *tpm,                // IN/OUT
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPM2B_DIGEST           *outHash             // OUT
)
{
    TPM2B_MAX_BUFFER    dataBuf;// = { (UINT16)dataSize };
    dataBuf.t.size = (UINT16)dataSize;

    if (dataSize > MAX_DIGEST_BUFFER)
        return TPM_RC_SIZE;
    MemoryCopy(dataBuf.t.buffer, data, dataSize);

    return TPM2_Hash(tpm, &dataBuf, hashAlg, TPM_RH_NULL, outHash, NULL);
}